

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O1

void feel_location(xchar x,xchar y)

{
  uchar *puVar1;
  char cVar2;
  monst *pmVar3;
  level *plVar4;
  boolean bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  obj *poVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined7 in_register_00000031;
  long lVar14;
  undefined7 in_register_00000039;
  monst *mon;
  rm *prVar15;
  bool worm_tail;
  uint bcprize;
  uint bcstack;
  long local_40;
  long local_38;
  
  plVar4 = level;
  lVar11 = (long)(int)CONCAT71(in_register_00000039,x);
  lVar12 = (long)(int)CONCAT71(in_register_00000031,y);
  if ((((level->locations[lVar11][lVar12].field_0x6 & 8) != 0) &&
      (pmVar3 = level->monsters[lVar11][lVar12], pmVar3 != (monst *)0x0)) &&
     ((pmVar3->field_0x61 & 2) == 0)) {
    return;
  }
  iVar6 = (int)x;
  iVar7 = (int)y;
  local_40 = lVar12;
  local_38 = lVar11;
  if ((((u._1052_1_ & 2) != 0) &&
      (bVar5 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar5 == '\0')) &&
     (bVar5 = is_pool(level,iVar6,iVar7), bVar5 == '\0')) {
    return;
  }
  lVar13 = (ulong)(u.ux != x) + 1;
  if (x < u.ux) {
    lVar13 = 0;
  }
  lVar14 = (ulong)(u.uy != y) + 1;
  if (u.uy < y) {
    lVar14 = 0;
  }
  prVar15 = plVar4->locations[lVar11] + lVar12;
  puVar1 = &plVar4->locations[lVar11][lVar12].seenv;
  *puVar1 = *puVar1 | seenv_matrix[lVar14][lVar13];
  if (((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
      ((youmonst.data)->mlet != '\x05')) ||
     ((bVar5 = on_level(&u.uz,&dungeon_topology.d_air_level), bVar5 != '\0' ||
      (bVar5 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar5 != '\0')))) {
    map_location(iVar6,iVar7,1);
    if (uball != (obj *)0x0) {
      if ((uchain->ox == x) && (uchain->oy == y)) {
        u.bc_felt._0_1_ = (byte)u.bc_felt | 2;
        bcprize = 0;
        bcstack = 0;
        topobj_at(iVar6,iVar7,'\x01',&u.cglyph,&u.cobjmn,&bcstack,&bcprize);
        u._996_1_ = ((byte)bcprize & 1) << 3 | u._996_1_ & 0xf5 | (byte)bcstack * '\x02' & 2;
      }
      if (((uball->where != '\x03') && (uball->ox == x)) && (uball->oy == y)) {
        u.bc_felt._0_1_ = (byte)u.bc_felt | 1;
        bcprize = 0;
        bcstack = 0;
        topobj_at(iVar6,iVar7,'\x01',&u.bglyph,&u.bobjmn,&bcstack,&bcprize);
        u._996_1_ = ((byte)bcprize & 1) << 2 | u._996_1_ & 0xfa | (byte)bcstack & 1;
      }
    }
    cVar2 = plVar4->locations[lVar11][lVar12].typ;
    if (cVar2 == '\x18') {
      if (((*(uint *)prVar15 & 0x3f) == 0xe) &&
         (uVar10 = *(uint *)&plVar4->locations[lVar11][lVar12].field_0x6, (uVar10 >> 0xb & 1) == 0))
      {
        *(uint *)prVar15 = *(uint *)prVar15 & 0xffffffc0 | 0xd;
        *(uint *)&plVar4->locations[lVar11][lVar12].field_0x6 = uVar10 & 0xfffff7fc;
        goto LAB_00169ce8;
      }
    }
    else if (((cVar2 == '\x19') && ((*(uint *)prVar15 & 0x3f) == 0xf)) &&
            (uVar10 = *(uint *)&plVar4->locations[lVar11][lVar12].field_0x6,
            (uVar10 >> 0xb & 1) == 0)) {
      *(uint *)prVar15 = *(uint *)prVar15 & 0xffffffc0 | 0x10;
      *(uint *)&plVar4->locations[lVar11][lVar12].field_0x6 = uVar10 & 0xfffff7fc;
LAB_00169ce8:
      dbuf_set(level,iVar6,iVar7,(rm *)0x0,-1,-1,-1,-1,-1,-1,-1,0,0,0);
    }
  }
  else {
    cVar2 = plVar4->locations[lVar11][lVar12].typ;
    if ((cVar2 < '\x11') ||
       ((cVar2 == '\x17' && ((plVar4->locations[lVar11][lVar12].field_0x6 & 0xc0) != 0)))) {
      map_background(x,y,1);
    }
    else {
      poVar9 = sobj_at(0x214,level,iVar6,iVar7);
      if (poVar9 == (obj *)0x0) {
        cVar2 = plVar4->locations[lVar11][lVar12].typ;
        if (cVar2 == '\x17') {
LAB_00169d93:
          map_background(x,y,1);
        }
        else {
          if (cVar2 < '\x19' && 3 < (byte)(cVar2 - 0x11U)) {
            map_background(x,y,1);
            if (((plVar4->locations[lVar11][lVar12].typ != '\x18') ||
                ((*(uint *)prVar15 & 0x3f) != 0xe)) ||
               (uVar10 = *(uint *)&plVar4->locations[lVar11][lVar12].field_0x6,
               (uVar10 >> 0xb & 1) != 0)) goto LAB_00169e6e;
            *(uint *)prVar15 = *(uint *)prVar15 & 0xffffffc0 | 0xd;
            uVar10 = uVar10 & 0xfffff7fc;
          }
          else {
            uVar8 = *(uint *)prVar15;
            if ((uVar8 & 0x1ff800) == 0x10a800) {
              if ((cVar2 != '\x19') && (plVar4->locations[lVar11][lVar12].seenv != '\0'))
              goto LAB_00169d93;
              uVar10 = *(uint *)&plVar4->locations[lVar11][lVar12].field_0x6;
              uVar8 = uVar8 & 0xfff0afc0;
            }
            else {
              if ((0xe < (uVar8 & 0x3f)) && ((plVar4->locations[lVar11][lVar12].field_0x6 & 8) == 0)
                 ) goto LAB_00169e6e;
              uVar10 = *(uint *)&plVar4->locations[lVar11][lVar12].field_0x6;
              uVar8 = uVar8 & 0xffffffc0;
            }
            *(uint *)prVar15 = uVar8 + ((uVar10 >> 0xb & 1) == 0) + 0xf;
            uVar10 = uVar10 & 0xfffffffc;
          }
          *(uint *)&plVar4->locations[lVar11][lVar12].field_0x6 = uVar10;
          dbuf_set_loc(iVar6,iVar7);
        }
      }
      else {
        map_object(poVar9,1);
      }
    }
  }
LAB_00169e6e:
  if ((u.ux == x) && (u.uy == y)) {
    return;
  }
  pmVar3 = level->monsters[local_38][local_40];
  mon = (monst *)0x0;
  if ((pmVar3 != (monst *)0x0) && ((pmVar3->field_0x61 & 2) == 0)) {
    mon = pmVar3;
  }
  if (mon == (monst *)0x0) {
    return;
  }
  if (((((mon->data->mflags1 & 0x10000) != 0) ||
       ((poVar9 = which_armor(mon,4), poVar9 != (obj *)0x0 &&
        (poVar9 = which_armor(mon,4), poVar9->otyp == 0x4f)))) ||
      ((((u.uprops[0x1e].intrinsic == 0 &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
         ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
           (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
           youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar6 = dist2((int)mon->mx,(int)mon->my,(int)u.ux,(int)u.uy), 0x40 < iVar6)))))) &&
     (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
      (bVar5 = match_warn_of_mon(mon), bVar5 == '\0')))) {
    return;
  }
  if (((mon->data->mflags1 & 0x10000) == 0) &&
     ((poVar9 = which_armor(mon,4), poVar9 == (obj *)0x0 ||
      (poVar9 = which_armor(mon,4), poVar9->otyp != 0x4f)))) {
    if (((u.uprops[0x1e].intrinsic != 0) ||
        (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
         (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
       ((((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
         (((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
          (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
          youmonst.data == mons + 0x32)) && (iVar6 = 1, u.uprops[0x19].blocked == 0))))
    goto LAB_0016a150;
    if ((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) {
      iVar7 = dist2((int)mon->mx,(int)mon->my,(int)u.ux,(int)u.uy);
      iVar6 = 1;
      if (iVar7 < 0x41) goto LAB_0016a150;
    }
  }
  bVar5 = match_warn_of_mon(mon);
  iVar6 = (bVar5 == '\0') + 1;
LAB_0016a150:
  worm_tail = true;
  if (mon->mx == x) {
    worm_tail = mon->my != y;
  }
  display_monster(x,y,mon,iVar6,worm_tail);
  return;
}

Assistant:

void feel_location(xchar x, xchar y)
{
    struct rm *loc = &(level->locations[x][y]);
    struct obj *boulder;
    struct monst *mon;

    /* If the hero's memory of an invisible monster is accurate, we want to keep
     * him from detecting the same monster over and over again on each turn.
     * We must return (so we don't erase the monster).  (We must also, in the
     * search function, be sure to skip over previously detected 'I's.)
     */
    if (level->locations[x][y].mem_invis && m_at(level, x,y)) return;

    /* The hero can't feel non pool locations while under water. */
    if (Underwater && !Is_waterlevel(&u.uz) && ! is_pool(level, x,y))
	return;

    /* Set the seen vector as if the hero had seen it.  It doesn't matter */
    /* if the hero is levitating or not.				  */
    set_seenv(loc, u.ux, u.uy, x, y);

    if (Levitation && !Is_airlevel(&u.uz) && !Is_waterlevel(&u.uz)) {
	/*
	 * Levitation Rules.  It is assumed that the hero can feel the state
	 * of the walls around herself and can tell if she is in a corridor,
	 * room, or doorway.  Boulders are felt because they are large enough.
	 * Anything else is unknown because the hero can't reach the ground.
	 * This makes things difficult.
	 *
	 * Check (and display) in order:
	 *
	 *	+ Stone, walls, and closed doors.
	 *	+ Boulders.  [see a boulder before a doorway]
	 *	+ Doors.
	 *	+ Room/water positions
	 *	+ Everything else (hallways!)
	 */
	if (IS_ROCK(loc->typ) || (IS_DOOR(loc->typ) &&
				(loc->doormask & (D_LOCKED | D_CLOSED)))) {
	    map_background(x, y, 1);
	} else if ((boulder = sobj_at(BOULDER, level, x,y)) != 0) {
	    map_object(boulder, 1);
	} else if (IS_DOOR(loc->typ)) {
	    map_background(x, y, 1);
	} else if (IS_ROOM(loc->typ) || IS_POOL(loc->typ)) {
	    /*
	     * An open room or water location.  Normally we wouldn't touch
	     * this, but we have to get rid of remembered boulder symbols.
	     * This will only occur in rare occations when the hero goes
	     * blind and doesn't find a boulder where expected (something
	     * came along and picked it up).  We know that there is not a
	     * boulder at this location.  Show fountains, pools, etc.
	     * underneath if already seen.  Otherwise, show the appropriate
	     * floor symbol.
	     *
	     * Similarly, if the hero digs a hole in a wall or feels a location
	     * that used to contain an unseen monster.  In these cases,
	     * there's no reason to assume anything was underneath, so
	     * just show the appropriate floor symbol.  If something was
	     * embedded in the wall, the glyph will probably already
	     * reflect that.  Don't change the symbol in this case.
	     *
	     * This isn't quite correct.  If the boulder was on top of some
	     * other objects they should be seen once the boulder is removed.
	     * However, we have no way of knowing that what is there now
	     * was there then.  So we let the hero have a lapse of memory.
	     * We could also just display what is currently on the top of the
	     * object stack (if anything).
	     */
	    if (loc->mem_obj - 1 == BOULDER) {
		if (loc->typ != ROOM && loc->seenv) {
		    map_background(x, y, 1);
		} else {
		    loc->mem_bg = loc->waslit ? S_room : S_darkroom;
		    loc->mem_door_l = 0;
		    loc->mem_door_t = 0;
		    dbuf_set_loc(x, y);
		}
	    } else if (loc->mem_bg < S_room || loc->mem_invis) {
		loc->mem_bg = loc->waslit ? S_room : S_darkroom;
		loc->mem_door_l = 0;
		loc->mem_door_t = 0;
		dbuf_set_loc(x, y);
	    }
	} else {
	    /* We feel it (I think hallways are the only things left). */
	    map_background(x, y, 1);
	    /* Corridors are never felt as lit (unless remembered that way) */
	    /* (lit_corridor only).					    */
	    if (loc->typ == CORR && loc->mem_bg == S_litcorr && !loc->waslit) {
		loc->mem_bg = S_corr;
		loc->mem_door_l = 0;
		loc->mem_door_t = 0;
		dbuf_set_loc(x, y);
	    }
	}
    } else {
	map_location(x, y, 1);

	if (Punished) {
	    /*
	     * Update object-under-ball/chain info for layered display system.
	     * If we don't, then when the ball/chain is moved it will drop
	     * the wrong glyph.
	     */
	    unsigned bcstack, bcprize;
	    if (uchain->ox == x && uchain->oy == y) {
		u.bc_felt |= BC_CHAIN;
		bcstack = bcprize = 0;
		topobj_at(x, y, TRUE, &u.cglyph, &u.cobjmn, &bcstack, &bcprize);
		u.cstack = bcstack;
		u.coprize = bcprize;
	    }
	    if (!carried(uball) && uball->ox == x && uball->oy == y) {
		u.bc_felt |= BC_BALL;
		bcstack = bcprize = 0;
		topobj_at(x, y, TRUE, &u.bglyph, &u.bobjmn, &bcstack, &bcprize);
		u.bstack = bcstack;
		u.boprize = bcprize;
	    }
	}

	/* Floor spaces are dark if unlit.  Corridors are dark if unlit. */
	if (loc->typ == ROOM && loc->mem_bg == S_room && !loc->waslit) {
	    loc->mem_bg = S_darkroom;
	    loc->mem_door_l = 0;
	    loc->mem_door_t = 0;
	    dbuf_set_loc(x, y);
	} else if (loc->typ == CORR &&
		    loc->mem_bg == S_litcorr && !loc->waslit) {
	    loc->mem_bg = S_corr;
	    loc->mem_door_l = 0;
	    loc->mem_door_t = 0;
	    dbuf_set_loc(x, y);
	}
    }
    /* draw monster on top if we can sense it */
    if ((x != u.ux || y != u.uy) && (mon = m_at(level, x,y)) && sensemon(mon))
	display_monster(x, y, mon,
		(tp_sensemon(mon) || match_warn_of_mon(mon)) ? PHYSICALLY_SEEN : DETECTED,
		is_worm_tail(mon));
}